

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_make_socket_closeonexec(int fd)

{
  uint uVar1;
  int iVar2;
  char *fmt;
  
  uVar1 = fcntl(fd,1,0);
  if ((int)uVar1 < 0) {
    fmt = "fcntl(%d, F_GETFD)";
  }
  else {
    if ((uVar1 & 1) != 0) {
      return 0;
    }
    iVar2 = fcntl(fd,2,(ulong)(uVar1 | 1));
    if (iVar2 != -1) {
      return 0;
    }
    fmt = "fcntl(%d, F_SETFD)";
  }
  event_warn(fmt,fd);
  return -1;
}

Assistant:

int
evutil_make_socket_closeonexec(evutil_socket_t fd)
{
#if !defined(_WIN32) && defined(EVENT__HAVE_SETFD)
	int flags;
	if ((flags = fcntl(fd, F_GETFD, NULL)) < 0) {
		event_warn("fcntl(%d, F_GETFD)", fd);
		return -1;
	}
	if (!(flags & FD_CLOEXEC)) {
		if (fcntl(fd, F_SETFD, flags | FD_CLOEXEC) == -1) {
			event_warn("fcntl(%d, F_SETFD)", fd);
			return -1;
		}
	}
#endif
	return 0;
}